

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O1

void __thiscall cashew::JSPrinter::newline(JSPrinter *this)

{
  size_t sVar1;
  int iVar2;
  
  if (this->pretty == true) {
    maybeSpace(this,'\n');
    ensure(this,1);
    sVar1 = this->used;
    this->used = sVar1 + 1;
    this->buffer[sVar1] = '\n';
    if (0 < this->indent) {
      iVar2 = 0;
      do {
        maybeSpace(this,' ');
        ensure(this,1);
        sVar1 = this->used;
        this->used = sVar1 + 1;
        this->buffer[sVar1] = ' ';
        iVar2 = iVar2 + 1;
      } while (iVar2 < this->indent);
    }
  }
  return;
}

Assistant:

void newline() {
    if (!pretty) {
      return;
    }
    emit('\n');
    for (int i = 0; i < indent; i++) {
      emit(' ');
    }
  }